

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

QRegion __thiscall QPainter::clipRegion(QPainter *this)

{
  QPainterPathPrivate *pQVar1;
  QPainterPathPrivate *pQVar2;
  int iVar3;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var4;
  FillRule FVar5;
  TransformationType TVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  long *in_RSI;
  qreal *pqVar10;
  QTransform *pQVar11;
  QRegion *this_00;
  long lVar12;
  QTransform *pQVar13;
  QPainterPath *this_01;
  long in_FS_OFFSET;
  byte bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  QTransform matrix;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar8 = *in_RSI;
  if (*(long *)(lVar8 + 0x118) == 0) {
    clipRegion();
  }
  else {
    (this->d_ptr)._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>
    ._M_t.super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
    super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         (QPainterPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    if ((*(byte *)(lVar8 + 0xf8) & 1) == 0) {
      lVar12 = *in_RSI;
      *(byte *)(lVar12 + 0xf8) = *(byte *)(lVar12 + 0xf8) | 1;
      QTransform::inverted(&local_88,(QTransform *)(*(long *)(lVar12 + 0x40) + 0xd8),(bool *)0x0);
      pQVar13 = &local_88;
      pqVar10 = (qreal *)(lVar12 + 0xa8);
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pqVar10 = pQVar13->m_matrix[0][0];
        pQVar13 = (QTransform *)((long)pQVar13 + ((ulong)bVar14 * -2 + 1) * 8);
        pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
      }
      *(undefined2 *)(lVar12 + 0xf0) = local_88._72_2_;
    }
    lVar12 = *(long *)(*(long *)(lVar8 + 0x40) + 0x80);
    if (lVar12 != 0) {
      pQVar13 = (QTransform *)(lVar8 + 0xa8);
      lVar12 = lVar12 * 0xa0;
      this_01 = (QPainterPath *)(*(long *)(*(long *)(lVar8 + 0x40) + 0x78) + 0x60);
      bVar9 = true;
      do {
        switch(*(undefined4 *)&this_01[-0xc].d_ptr.d.ptr) {
        case 0:
          pqVar10 = (qreal *)&DAT_006af528;
          pQVar11 = &local_88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            pQVar11->m_matrix[0][0] = *pqVar10;
            pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
            pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar13);
          if (bVar9) {
            QTransform::map(&local_d8,(QRegion *)&local_88);
            _Var4._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var4._M_head_impl;
            QRegion::~QRegion((QRegion *)&local_d8);
            bVar9 = false;
          }
          else {
            iVar3 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar3 == 0) {
LAB_003d7571:
              QRegion::QRegion((QRegion *)&local_d8);
LAB_003d7592:
              _Var4._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_d8.m_matrix[0][0];
              local_d8.m_matrix[0][0] = (qreal)_Var4._M_head_impl;
              QRegion::~QRegion((QRegion *)&local_d8);
              bVar9 = true;
            }
            else {
              if (iVar3 == 2) {
                QTransform::map(&local_d8,(QRegion *)&local_88);
                QRegion::operator&=((QRegion *)this,(QRegion *)&local_d8);
              }
              else {
                QTransform::map(&local_d8,(QRegion *)&local_88);
                _Var4._M_head_impl =
                     (this->d_ptr)._M_t.
                     super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>
                     .super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
                (this->d_ptr)._M_t.
                super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                     (QPainterPrivate *)local_d8.m_matrix[0][0];
                local_d8.m_matrix[0][0] = (qreal)_Var4._M_head_impl;
              }
              QRegion::~QRegion((QRegion *)&local_d8);
            }
          }
          break;
        case 1:
          pqVar10 = (qreal *)&DAT_006af528;
          pQVar11 = &local_88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            pQVar11->m_matrix[0][0] = *pqVar10;
            pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
            pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar13);
          if (bVar9) {
            QTransform::map((QTransform *)local_118,(QPainterPath *)&local_88);
            pqVar10 = (qreal *)&DAT_006af4e0;
            pQVar11 = &local_d8;
            for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
              pQVar11->m_matrix[0][0] = *pqVar10;
              pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
              pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
            }
            local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
            QPainterPath::toFillPolygon
                      ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
            QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
            FVar5 = QPainterPath::fillRule(this_01);
            QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar5);
            _Var4._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_f8._24_8_;
            local_f8._24_8_ = _Var4._M_head_impl;
            QRegion::~QRegion((QRegion *)(local_f8 + 0x18));
            if ((QPainterPrivate *)local_f8._0_8_ != (QPainterPrivate *)0x0) {
              LOCK();
              (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i =
                   (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_f8._0_8_,8,0x10);
              }
            }
            if ((QArrayData *)local_118._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_118._8_8_,0x10,0x10);
              }
            }
            QPainterPath::~QPainterPath((QPainterPath *)local_118);
            bVar9 = false;
          }
          else {
            iVar3 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar3 == 0) {
LAB_003d7580:
              QRegion::QRegion((QRegion *)&local_d8);
              goto LAB_003d7592;
            }
            if (iVar3 == 2) {
              QTransform::map((QTransform *)local_118,(QPainterPath *)&local_88);
              pqVar10 = (qreal *)&DAT_006af4e0;
              pQVar11 = &local_d8;
              for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
                pQVar11->m_matrix[0][0] = *pqVar10;
                pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
                pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
              }
              local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
              QPainterPath::toFillPolygon
                        ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
              QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
              FVar5 = QPainterPath::fillRule(this_01);
              QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar5);
              QRegion::operator&=((QRegion *)this,(QRegion *)(local_f8 + 0x18));
            }
            else {
              QTransform::map((QTransform *)local_118,(QPainterPath *)&local_88);
              pqVar10 = (qreal *)&DAT_006af4e0;
              pQVar11 = &local_d8;
              for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
                pQVar11->m_matrix[0][0] = *pqVar10;
                pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
                pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
              }
              local_d8._72_2_ = local_d8._72_2_ & 0xfc00;
              QPainterPath::toFillPolygon
                        ((QPolygonF *)(local_118 + 8),(QPainterPath *)local_118,&local_d8);
              QPolygonF::toPolygon((QPolygon *)local_f8,(QPolygonF *)(local_118 + 8));
              FVar5 = QPainterPath::fillRule(this_01);
              QRegion::QRegion((QRegion *)(local_f8 + 0x18),(QPolygon *)local_f8,FVar5);
              _Var4._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_f8._24_8_;
              local_f8._24_8_ = _Var4._M_head_impl;
            }
            QRegion::~QRegion((QRegion *)(local_f8 + 0x18));
            if ((QPainterPrivate *)local_f8._0_8_ != (QPainterPrivate *)0x0) {
              LOCK();
              (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i =
                   (((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((RefCount *)local_f8._0_8_)->atomic)._q_value.super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_f8._0_8_,8,0x10);
              }
            }
            if ((QArrayData *)local_118._8_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_118._8_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_118._8_8_,0x10,0x10);
              }
            }
            QPainterPath::~QPainterPath((QPainterPath *)local_118);
          }
          break;
        case 2:
          pqVar10 = (qreal *)&DAT_006af528;
          pQVar11 = &local_88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            pQVar11->m_matrix[0][0] = *pqVar10;
            pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
            pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar13);
          if (bVar9) {
            this_00 = (QRegion *)local_f8;
            QRegion::QRegion(this_00,(QRect *)(this_01 + 2),Rectangle);
            QTransform::map(&local_d8,(QRegion *)&local_88);
            _Var4._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_d8.m_matrix[0][0];
            local_d8.m_matrix[0][0] = (qreal)_Var4._M_head_impl;
            QRegion::~QRegion((QRegion *)&local_d8);
            bVar9 = false;
          }
          else {
            iVar3 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar3 == 0) goto LAB_003d7571;
            if (iVar3 == 2) {
              TVar6 = QTransform::type(&local_88);
              if ((int)TVar6 < 3) {
                local_d8.m_matrix[0]._0_16_ = QTransform::mapRect(&local_88,(QRect *)(this_01 + 2));
LAB_003d7482:
                QRegion::operator&=((QRegion *)this,(QRect *)&local_d8);
                break;
              }
              QRegion::QRegion((QRegion *)local_f8,(QRect *)(this_01 + 2),Rectangle);
              QTransform::map(&local_d8,(QRegion *)&local_88);
              QRegion::operator&=((QRegion *)this,(QRegion *)&local_d8);
            }
            else {
              QRegion::QRegion((QRegion *)local_f8,(QRect *)(this_01 + 2),Rectangle);
              QTransform::map(&local_d8,(QRegion *)&local_88);
              _Var4._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_d8.m_matrix[0][0];
              local_d8.m_matrix[0][0] = (qreal)_Var4._M_head_impl;
            }
            this_00 = (QRegion *)local_f8;
            QRegion::~QRegion((QRegion *)&local_d8);
          }
          goto LAB_003d78a3;
        case 3:
          pqVar10 = (qreal *)&DAT_006af528;
          pQVar11 = &local_88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            pQVar11->m_matrix[0][0] = *pqVar10;
            pqVar10 = pqVar10 + (ulong)bVar14 * -2 + 1;
            pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar14 * -2 + 1) * 8);
          }
          QTransform::operator*(&local_88,(QTransform *)(this_01 + -0xb),pQVar13);
          if (bVar9) {
            pQVar1 = this_01[4].d_ptr.d.ptr;
            pQVar2 = this_01[5].d_ptr.d.ptr;
            dVar17 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                     (double)pQVar1;
            dVar19 = 2147483647.0;
            if (dVar17 <= 2147483647.0) {
              dVar19 = dVar17;
            }
            if (dVar19 <= -2147483648.0) {
              dVar19 = -2147483648.0;
            }
            dVar18 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                     (double)pQVar2;
            dVar17 = 2147483647.0;
            if (dVar18 <= 2147483647.0) {
              dVar17 = dVar18;
            }
            if (dVar17 <= -2147483648.0) {
              dVar17 = -2147483648.0;
            }
            dVar16 = ((double)pQVar1 - (double)(int)dVar19) * 0.5 + (double)this_01[6].d_ptr.d.ptr;
            dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
            dVar18 = 2147483647.0;
            if (dVar16 <= 2147483647.0) {
              dVar18 = dVar16;
            }
            if (dVar18 <= -2147483648.0) {
              dVar18 = -2147483648.0;
            }
            dVar15 = ((double)pQVar2 - (double)(int)dVar17) * 0.5 + (double)this_01[7].d_ptr.d.ptr;
            dVar15 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
            dVar16 = 2147483647.0;
            if (dVar15 <= 2147483647.0) {
              dVar16 = dVar15;
            }
            if (dVar16 <= -2147483648.0) {
              dVar16 = -2147483648.0;
            }
            local_d8.m_matrix[0][0]._4_4_ = (int)dVar17;
            local_d8.m_matrix[0][0]._0_4_ = (int)dVar19;
            local_d8.m_matrix[0][1]._4_4_ = (int)dVar16 + (int)dVar17 + -1;
            local_d8.m_matrix[0][1]._0_4_ = (int)dVar18 + (int)dVar19 + -1;
            this_00 = (QRegion *)(local_118 + 8);
            QRegion::QRegion(this_00,(QRect *)&local_d8,Rectangle);
            QTransform::map((QTransform *)local_f8,(QRegion *)&local_88);
            _Var4._M_head_impl =
                 (this->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
            (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                 (QPainterPrivate *)local_f8._0_8_;
            bVar9 = false;
            local_f8._0_8_ = _Var4._M_head_impl;
            QRegion::~QRegion((QRegion *)local_f8);
          }
          else {
            iVar3 = *(int *)&this_01[-1].d_ptr.d.ptr;
            if (iVar3 == 0) goto LAB_003d7580;
            if (iVar3 == 2) {
              TVar6 = QTransform::type(&local_88);
              if ((int)TVar6 < 3) {
                pQVar1 = this_01[4].d_ptr.d.ptr;
                pQVar2 = this_01[5].d_ptr.d.ptr;
                dVar17 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                         (double)pQVar1;
                dVar19 = 2147483647.0;
                if (dVar17 <= 2147483647.0) {
                  dVar19 = dVar17;
                }
                if (dVar19 <= -2147483648.0) {
                  dVar19 = -2147483648.0;
                }
                dVar18 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                         (double)pQVar2;
                dVar17 = 2147483647.0;
                if (dVar18 <= 2147483647.0) {
                  dVar17 = dVar18;
                }
                if (dVar17 <= -2147483648.0) {
                  dVar17 = -2147483648.0;
                }
                dVar16 = ((double)pQVar1 - (double)(int)dVar19) * 0.5 +
                         (double)this_01[6].d_ptr.d.ptr;
                dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
                dVar18 = 2147483647.0;
                if (dVar16 <= 2147483647.0) {
                  dVar18 = dVar16;
                }
                if (dVar18 <= -2147483648.0) {
                  dVar18 = -2147483648.0;
                }
                dVar15 = ((double)pQVar2 - (double)(int)dVar17) * 0.5 +
                         (double)this_01[7].d_ptr.d.ptr;
                dVar15 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
                dVar16 = 2147483647.0;
                if (dVar15 <= 2147483647.0) {
                  dVar16 = dVar15;
                }
                if (dVar16 <= -2147483648.0) {
                  dVar16 = -2147483648.0;
                }
                local_f8._0_8_ = CONCAT44((int)dVar17,(int)dVar19);
                local_f8._8_8_ =
                     CONCAT44((int)dVar16 + (int)dVar17 + -1,(int)dVar18 + (int)dVar19 + -1);
                local_d8.m_matrix[0]._0_16_ = QTransform::mapRect(&local_88,(QRect *)local_f8);
                goto LAB_003d7482;
              }
              pQVar1 = this_01[4].d_ptr.d.ptr;
              pQVar2 = this_01[5].d_ptr.d.ptr;
              dVar17 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar1;
              dVar19 = 2147483647.0;
              if (dVar17 <= 2147483647.0) {
                dVar19 = dVar17;
              }
              if (dVar19 <= -2147483648.0) {
                dVar19 = -2147483648.0;
              }
              dVar18 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar2;
              dVar17 = 2147483647.0;
              if (dVar18 <= 2147483647.0) {
                dVar17 = dVar18;
              }
              if (dVar17 <= -2147483648.0) {
                dVar17 = -2147483648.0;
              }
              dVar16 = ((double)pQVar1 - (double)(int)dVar19) * 0.5 + (double)this_01[6].d_ptr.d.ptr
              ;
              dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
              dVar18 = 2147483647.0;
              if (dVar16 <= 2147483647.0) {
                dVar18 = dVar16;
              }
              if (dVar18 <= -2147483648.0) {
                dVar18 = -2147483648.0;
              }
              dVar15 = ((double)pQVar2 - (double)(int)dVar17) * 0.5 + (double)this_01[7].d_ptr.d.ptr
              ;
              dVar15 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
              dVar16 = 2147483647.0;
              if (dVar15 <= 2147483647.0) {
                dVar16 = dVar15;
              }
              if (dVar16 <= -2147483648.0) {
                dVar16 = -2147483648.0;
              }
              local_d8.m_matrix[0][0]._4_4_ = (int)dVar17;
              local_d8.m_matrix[0][0]._0_4_ = (int)dVar19;
              local_d8.m_matrix[0][1]._4_4_ = (int)dVar16 + (int)dVar17 + -1;
              local_d8.m_matrix[0][1]._0_4_ = (int)dVar18 + (int)dVar19 + -1;
              QRegion::QRegion((QRegion *)(local_118 + 8),(QRect *)&local_d8,Rectangle);
              QTransform::map((QTransform *)local_f8,(QRegion *)&local_88);
              QRegion::operator&=((QRegion *)this,(QRegion *)local_f8);
              QRegion::~QRegion((QRegion *)local_f8);
              this_00 = (QRegion *)(local_118 + 8);
            }
            else {
              pQVar1 = this_01[4].d_ptr.d.ptr;
              pQVar2 = this_01[5].d_ptr.d.ptr;
              dVar17 = (double)((ulong)pQVar1 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar1;
              dVar19 = 2147483647.0;
              if (dVar17 <= 2147483647.0) {
                dVar19 = dVar17;
              }
              if (dVar19 <= -2147483648.0) {
                dVar19 = -2147483648.0;
              }
              dVar18 = (double)((ulong)pQVar2 & 0x8000000000000000 | 0x3fe0000000000000) +
                       (double)pQVar2;
              dVar17 = 2147483647.0;
              if (dVar18 <= 2147483647.0) {
                dVar17 = dVar18;
              }
              if (dVar17 <= -2147483648.0) {
                dVar17 = -2147483648.0;
              }
              dVar16 = ((double)pQVar1 - (double)(int)dVar19) * 0.5 + (double)this_01[6].d_ptr.d.ptr
              ;
              dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
              dVar18 = 2147483647.0;
              if (dVar16 <= 2147483647.0) {
                dVar18 = dVar16;
              }
              if (dVar18 <= -2147483648.0) {
                dVar18 = -2147483648.0;
              }
              dVar15 = ((double)pQVar2 - (double)(int)dVar17) * 0.5 + (double)this_01[7].d_ptr.d.ptr
              ;
              dVar15 = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
              dVar16 = 2147483647.0;
              if (dVar15 <= 2147483647.0) {
                dVar16 = dVar15;
              }
              if (dVar16 <= -2147483648.0) {
                dVar16 = -2147483648.0;
              }
              local_d8.m_matrix[0][0]._4_4_ = (int)dVar17;
              local_d8.m_matrix[0][0]._0_4_ = (int)dVar19;
              local_d8.m_matrix[0][1]._4_4_ = (int)dVar16 + (int)dVar17 + -1;
              local_d8.m_matrix[0][1]._0_4_ = (int)dVar18 + (int)dVar19 + -1;
              this_00 = (QRegion *)(local_118 + 8);
              QRegion::QRegion(this_00,(QRect *)&local_d8,Rectangle);
              QTransform::map((QTransform *)local_f8,(QRegion *)&local_88);
              _Var4._M_head_impl =
                   (this->d_ptr)._M_t.
                   super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                   super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
              (this->d_ptr)._M_t.
              super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
              super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
              super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
                   (QPainterPrivate *)local_f8._0_8_;
              local_f8._0_8_ = _Var4._M_head_impl;
              QRegion::~QRegion((QRegion *)local_f8);
            }
          }
LAB_003d78a3:
          QRegion::~QRegion(this_00);
        }
        this_01 = this_01 + 0x14;
        lVar12 = lVar12 + -0xa0;
      } while (lVar12 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QPainter::clipRegion() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::clipRegion: Painter not active");
        return QRegion();
    }

    QRegion region;
    bool lastWasNothing = true;

    if (!d->txinv)
        const_cast<QPainter *>(this)->d_ptr->updateInvMatrix();

    // ### Falcon: Use QPainterPath
    for (const QPainterClipInfo &info : std::as_const(d->state->clipInfo)) {
        switch (info.clipType) {

        case QPainterClipInfo::RegionClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = info.region * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip)
                region &= info.region * matrix;
            else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else
                region = info.region * matrix;
            break;
        }

        case QPainterClipInfo::PathClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                region &= QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                  info.path.fillRule());
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion((info.path * matrix).toFillPolygon().toPolygon(),
                                 info.path.fillRule());
            }
            break;
        }

        case QPainterClipInfo::RectClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rect) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rect);
                else
                    region &= matrix.map(QRegion(info.rect));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rect) * matrix;
            }
            break;
        }

        case QPainterClipInfo::RectFClip: {
            QTransform matrix = (info.matrix * d->invMatrix);
            if (lastWasNothing) {
                region = QRegion(info.rectf.toRect()) * matrix;
                lastWasNothing = false;
                continue;
            }
            if (info.operation == Qt::IntersectClip) {
                // Use rect intersection if possible.
                if (matrix.type() <= QTransform::TxScale)
                    region &= matrix.mapRect(info.rectf.toRect());
                else
                    region &= matrix.map(QRegion(info.rectf.toRect()));
            } else if (info.operation == Qt::NoClip) {
                lastWasNothing = true;
                region = QRegion();
            } else {
                region = QRegion(info.rectf.toRect()) * matrix;
            }
            break;
        }
        }
    }

    return region;
}